

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate.cpp
# Opt level: O2

int add_to_database_so(Map *symbol_file_map,string_view file_path)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  istream *piVar6;
  mapped_type *pmVar7;
  char *__s;
  string_view command;
  basic_string_view<char,_std::char_traits<char>_> __x;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  allocator<char> local_239;
  string line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  stringstream ss;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d8,"objdump -TCw ",&local_239);
  std::operator+(&local_1f8,&local_1d8,file_path._M_str);
  command._M_str = local_1f8._M_dataplus._M_p;
  command._M_len = local_1f8._M_string_length;
  get_output_from_command_abi_cxx11_(&line,command);
  std::__cxx11::stringstream::stringstream((stringstream *)&ss,(string *)&line,_S_out|_S_in);
  std::__cxx11::string::~string((string *)&line);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_1d8);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&ss,(string *)&line);
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&ss,(string *)&line);
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&ss,(string *)&line);
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&ss,(string *)&line);
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&ss,(string *)&line);
  iVar3 = 0;
  lVar4 = std::__cxx11::string::find((char *)&line,0x1280de);
  if ((lVar4 != -1) && (lVar5 = std::__cxx11::string::rfind((char *)&line,0x1280de), lVar5 != -1)) {
    iVar3 = 0;
    do {
      do {
        piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)&ss,(string *)&line);
        if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) goto LAB_0011c3a7;
        __x._M_str = line._M_dataplus._M_p + lVar4;
        __x._M_len = 5;
        __y._M_str = "*UND*";
        __y._M_len = 5;
        bVar2 = std::experimental::fundamentals_v1::operator==(__x,__y);
      } while (bVar2);
      pcVar1 = line._M_dataplus._M_p + lVar5 + -3;
      do {
        __s = pcVar1;
        pcVar1 = __s + 1;
      } while (*__s != ' ');
      do {
        pcVar1 = __s + 1;
        __s = __s + 1;
      } while (*pcVar1 == ' ');
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f8,__s,(allocator<char> *)&local_1d8);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](symbol_file_map,&local_1f8);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::__cxx11::string::push_back((char)pmVar7);
      std::__cxx11::string::append((char *)pmVar7);
      iVar3 = iVar3 + 1;
    } while( true );
  }
LAB_0011c3a7:
  std::__cxx11::string::~string((string *)&line);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return iVar3;
}

Assistant:

int add_to_database_so(Map &symbol_file_map, const string_view file_path) {
	int symbols = 0;
	std::stringstream ss(get_output_from_command(std::string("objdump -TCw ") + file_path.data()));
	std::string line;
	std::getline(ss, line); //empty line
	std::getline(ss, line); //file format
	std::getline(ss, line); //empty line
	std::getline(ss, line); //caption
	std::getline(ss, line); //.init line
	auto linit = line.find(".init");
	if (linit == std::string::npos) {
		return symbols;
	}
	auto rinit = line.rfind(".init");
	if (rinit == std::string::npos) {
		return symbols;
	}
	while (std::getline(ss, line)) {
		if (string_view(line.data() + linit, 5) == "*UND*") {
			continue;
		}
		auto symbol_pos = line.data() + rinit - 3;
		while (*symbol_pos++ != ' ') {
		}
		while (*symbol_pos == ' ') {
			symbol_pos++;
		}
		auto &entry = symbol_file_map[symbol_pos];
		entry.push_back(file_separator);
		entry += file_path.data();
		symbols++;
	}
	return symbols;
}